

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O3

bool __thiscall Clasp::Lookahead::test(Lookahead *this,Solver *s,Literal p)

{
  bool bVar1;
  
  if ((*(uint *)(&((this->score).score.ebo_.buf)->field_0x0 + (p.rep_ & 0xfffffffc)) >> 0x1c &
      2 - ((p.rep_ & 2) == 0)) == 0) {
    bVar1 = Solver::test(s,p,&this->super_PostPropagator);
    if (bVar1) goto LAB_0018e7a9;
LAB_0018e802:
    bVar1 = false;
  }
  else {
LAB_0018e7a9:
    if (((p.rep_ & 1) != 0) &&
       (((uint)(this->score).score.ebo_.buf[p.rep_ >> 2] >> 0x1c & ((p.rep_ & 2) == 0) + 1) == 0)) {
      bVar1 = Solver::test(s,(Literal)(p.rep_ & 0xfffffffe ^ 2),&this->super_PostPropagator);
      if (!bVar1) goto LAB_0018e802;
    }
    if ((this->imps_).ebo_.size != 0) {
      bVar1 = checkImps(this,s,p);
      return bVar1;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Lookahead::test(Solver& s, Literal p) {
	return (score.score[p.var()].seen(p) || s.test(p, this))
		&& (!p.flagged() || score.score[p.var()].seen(~p) || s.test(~p, this))
		&& (imps_.empty() || checkImps(s, p));
}